

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_MergeFeaturesUnknownEnumFeature_Test::TestBody
          (FeatureResolverTest_MergeFeaturesUnknownEnumFeature_Test *this)

{
  bool bVar1;
  int iVar2;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *this_02;
  FeatureResolver *this_03;
  VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *gmock_p0;
  HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *matcher;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  string_view sVar3;
  MatcherBaseImpl<google::protobuf::(anonymous_namespace)::StatusIsMatcherP<absl::lts_20250127::StatusCode>_>
  in_stack_fffffffffffffc10;
  AssertHelper local_380;
  Message local_378;
  FeatureSet local_370;
  StatusOr<google::protobuf::FeatureSet> local_320;
  string_view local_2c8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  string_view local_278;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  AllOfMatcher<typename_std::decay<const_PolymorphicMatcher<HasSubstrMatcher<basic_string<char>_>_>_&>::type,_typename_std::decay<const_PolymorphicMatcher<HasSubstrMatcher<basic_string<char>_>_>_&>::type,_typename_std::decay<const_PolymorphicMatcher<HasSubstrMatcher<basic_string<char>_>_>_&>::type>
  local_248;
  HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1e8;
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_188;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Reflection *reflection;
  FeatureSet features;
  FieldDescriptor *field;
  int i;
  Descriptor *descriptor;
  AssertHelper local_a0;
  Message local_98 [3];
  anon_unknown_0 local_80 [4];
  char local_7c [4];
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  StatusOr<google::protobuf::FeatureResolver> resolver;
  FeatureResolverTest_MergeFeaturesUnknownEnumFeature_Test *this_local;
  
  SetupFeatureResolver<>
            ((StatusOr<google::protobuf::FeatureResolver> *)&gtest_ar.message_,EDITION_2023);
  StatusIs<absl::lts_20250127::StatusCode>(local_80,kOk);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::StatusIsMatcherP<absl::lts_20250127::StatusCode>>
            ((StatusIsMatcherP<absl::lts_20250127::StatusCode>)
             in_stack_fffffffffffffc10.params_.
             super__Tuple_impl<0UL,_absl::lts_20250127::StatusCode>.
             super__Head_base<0UL,_absl::lts_20250127::StatusCode,_false>._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::StatusIsMatcherP<absl::lts_20250127::StatusCode>>
  ::operator()(local_78,local_7c,(StatusOr<google::protobuf::FeatureResolver> *)"resolver");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_98);
    in_R8 = (PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x206,(char *)in_R8);
    testing::internal::AssertHelper::operator=(&local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (bVar1) {
    this_00 = FeatureSet::descriptor();
    field._4_4_ = 0;
    while( true ) {
      iVar2 = Descriptor::field_count(this_00);
      if (iVar2 <= field._4_4_) break;
      features.field_0._56_8_ = Descriptor::field(this_00,field._4_4_);
      FeatureSet::FeatureSet((FeatureSet *)&reflection);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )FeatureSet::GetReflection();
      Reflection::SetEnumValue
                ((Reflection *)
                 gtest_ar_1.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,(Message *)&reflection,(FieldDescriptor *)features.field_0._56_8_,0);
      sVar3 = FieldDescriptor::name((FieldDescriptor *)features.field_0._56_8_);
      local_278 = sVar3;
      testing::HasSubstr<std::basic_string_view<char,std::char_traits<char>>>
                (&local_268,(testing *)&local_278,
                 (StringLike<std::basic_string_view<char>_> *)sVar3._M_str);
      testing::HasSubstr<char[30]>
                (&local_298,(StringLike<char[30]> *)"must resolve to a known value");
      this_01 = FieldDescriptor::enum_type((FieldDescriptor *)features.field_0._56_8_);
      this_02 = EnumDescriptor::FindValueByNumber(this_01,0);
      sVar3 = EnumValueDescriptor::name(this_02);
      local_2c8 = sVar3;
      testing::HasSubstr<std::basic_string_view<char,std::char_traits<char>>>
                (&local_2b8,(testing *)&local_2c8,
                 (StringLike<std::basic_string_view<char>_> *)sVar3._M_str);
      testing::
      AllOf<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
                (&local_248,(testing *)&local_268,&local_298,&local_2b8,in_R8);
      protobuf::(anonymous_namespace)::
      HasError<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
                (&local_1e8,(_anonymous_namespace_ *)&local_248,gmock_p0);
      testing::internal::
      MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>
                (&local_188,(internal *)&local_1e8,matcher);
      this_03 = absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::operator->
                          ((StatusOr<google::protobuf::FeatureResolver> *)&gtest_ar.message_);
      FeatureSet::FeatureSet(&local_370);
      FeatureResolver::MergeFeatures(&local_320,this_03,&local_370,(FeatureSet *)&reflection);
      testing::internal::
      PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>
      ::operator()(local_128,(char *)&local_188,
                   (StatusOr<google::protobuf::FeatureSet> *)
                   "resolver->MergeFeatures(FeatureSet(), features)");
      absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::~StatusOr(&local_320);
      FeatureSet::~FeatureSet(&local_370);
      testing::internal::
      PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~PredicateFormatterFromMatcher(&local_188);
      HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~HasErrorMatcherP(&local_1e8);
      testing::internal::
      VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~VariadicMatcher(&local_248);
      testing::
      PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~PolymorphicMatcher(&local_2b8);
      testing::
      PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~PolymorphicMatcher(&local_298);
      testing::
      PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~PolymorphicMatcher(&local_268);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_378);
        in_R8 = (PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)testing::AssertionResult::failure_message((AssertionResult *)local_128);
        testing::internal::AssertHelper::AssertHelper
                  (&local_380,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
                   ,0x216,(char *)in_R8);
        testing::internal::AssertHelper::operator=(&local_380,&local_378);
        testing::internal::AssertHelper::~AssertHelper(&local_380);
        testing::Message::~Message(&local_378);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      FeatureSet::~FeatureSet((FeatureSet *)&reflection);
      field._4_4_ = field._4_4_ + 1;
    }
  }
  absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::~StatusOr
            ((StatusOr<google::protobuf::FeatureResolver> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(FeatureResolverTest, MergeFeaturesUnknownEnumFeature) {
  absl::StatusOr<FeatureResolver> resolver = SetupFeatureResolver(EDITION_2023);
  ASSERT_OK(resolver);

  // Use reflection to make sure we validate every enum feature in FeatureSet.
  const Descriptor& descriptor = *FeatureSet::descriptor();
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);

    FeatureSet features;
    const Reflection& reflection = *features.GetReflection();

    // Set the feature to a value of 0, which is unknown by convention.
    reflection.SetEnumValue(&features, &field, 0);
    EXPECT_THAT(
        resolver->MergeFeatures(FeatureSet(), features),
        HasError(AllOf(
            HasSubstr(field.name()), HasSubstr("must resolve to a known value"),
            HasSubstr(field.enum_type()->FindValueByNumber(0)->name()))));
  }
}